

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

void Fossilize::
     serialize_application_info_inline<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               (Value *value,VkApplicationInfo *info,
               MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc)

{
  VkApplicationInfo *pVVar1;
  GenericStringRef<char> local_90;
  GenericStringRef<char> local_80;
  GenericStringRef<char> local_70;
  StringRefType local_60;
  GenericStringRef<char> local_50;
  StringRefType local_40;
  GenericStringRef<char> local_30;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *local_20;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc_local;
  VkApplicationInfo *info_local;
  Value *value_local;
  
  local_20 = alloc;
  alloc_local = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)info;
  info_local = (VkApplicationInfo *)value;
  if (info->pApplicationName != (char *)0x0) {
    rapidjson::GenericStringRef<char>::GenericStringRef<16u>
              (&local_30,(char (*) [16])"applicationName");
    rapidjson::StringRef<char>((rapidjson *)&local_40,(char *)alloc_local->userBuffer_);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember(value,&local_30,&local_40,local_20);
  }
  pVVar1 = info_local;
  if (alloc_local->ownBaseAllocator_ != (CrtAllocator *)0x0) {
    rapidjson::GenericStringRef<char>::GenericStringRef<11u>(&local_50,(char (*) [11])"engineName");
    rapidjson::StringRef<char>((rapidjson *)&local_60,(char *)alloc_local->ownBaseAllocator_);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)pVVar1,&local_50,&local_60,local_20);
  }
  pVVar1 = info_local;
  rapidjson::GenericStringRef<char>::GenericStringRef<19u>
            (&local_70,(char (*) [19])"applicationVersion");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)pVVar1,&local_70,*(uint *)&alloc_local->baseAllocator_,local_20);
  pVVar1 = info_local;
  rapidjson::GenericStringRef<char>::GenericStringRef<14u>(&local_80,(char (*) [14])"engineVersion")
  ;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)pVVar1,&local_80,*(uint *)&alloc_local[1].chunkHead_,local_20);
  pVVar1 = info_local;
  rapidjson::GenericStringRef<char>::GenericStringRef<11u>(&local_90,(char (*) [11])"apiVersion");
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)pVVar1,&local_90,*(uint *)((long)&alloc_local[1].chunkHead_ + 4),local_20);
  return;
}

Assistant:

static void serialize_application_info_inline(Value &value, const VkApplicationInfo &info, AllocType &alloc)
{
	if (info.pApplicationName)
		value.AddMember("applicationName", StringRef(info.pApplicationName), alloc);
	if (info.pEngineName)
		value.AddMember("engineName", StringRef(info.pEngineName), alloc);
	value.AddMember("applicationVersion", info.applicationVersion, alloc);
	value.AddMember("engineVersion", info.engineVersion, alloc);
	value.AddMember("apiVersion", info.apiVersion, alloc);
}